

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O3

void __thiscall Professor::print(Professor *this,bool with_marks)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"prof: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->surname)._M_dataplus._M_p,
                      (this->surname)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->middle_name)._M_dataplus._M_p,
                      (this->middle_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((int)CONCAT71(in_register_00000031,with_marks) != 0) {
    poVar1 = std::ostream::_M_insert<double>(this->knowledge);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(this->skill);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(this->social);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(this->loyality);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<double>(this->total);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    return;
  }
  return;
}

Assistant:

void Professor::print (bool with_marks){

    std::cout << "prof: ";
    std::cout << surname << " ";
    std::cout << name << " ";
    std::cout << middle_name << " ";
    if (with_marks) {
        std::cout << knowledge << " ";
        std::cout << skill << " ";
        std::cout << social << " ";
        std::cout << loyality << " ";
        std::cout << total << " ";
    }

}